

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O1

float * vera::skyEquirectangular(SkyData *_sky,size_t _width,size_t _height)

{
  float __x;
  float *pfVar1;
  ArHosekSkyModelState *state;
  ArHosekSkyModelState *state_00;
  ArHosekSkyModelState *state_01;
  size_t sVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int x;
  size_t sVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar17;
  double dVar18;
  double elevation;
  float fVar19;
  double theta;
  
  lVar6 = ((ulong)(uint)((int)_width * (int)_height) << 0x20) * 3;
  uVar5 = 0xffffffffffffffff;
  if (-1 < lVar6) {
    uVar5 = lVar6 >> 0x1e;
  }
  pfVar1 = (float *)operator_new__(uVar5);
  elevation = (double)_sky->elevation;
  state = arhosek_xyz_skymodelstate_alloc_init
                    ((double)_sky->turbidity,(double)(_sky->groundAlbedo).field_0.x,elevation);
  state_00 = arhosek_xyz_skymodelstate_alloc_init
                       ((double)_sky->turbidity,(double)(_sky->groundAlbedo).field_1.y,elevation);
  state_01 = arhosek_xyz_skymodelstate_alloc_init
                       ((double)_sky->turbidity,(double)(_sky->groundAlbedo).field_2.z,elevation);
  if (_height == 0) {
    fVar19 = 1e-05;
  }
  else {
    fVar19 = 1e-05;
    lVar6 = 0;
    sVar2 = 0;
    do {
      __x = (((float)(int)sVar2 + 0.5) / (float)_height) * 3.1415927;
      theta = (double)__x;
      if (theta <= 1.5707963267948966 && _width != 0) {
        sVar8 = 0;
        lVar9 = lVar6;
        do {
          fVar12 = _sky->azimuth;
          fVar10 = sinf(__x);
          fVar11 = sinf((float)(1.5707963267948966 - elevation));
          fVar12 = cosf(0.0 - (fVar12 + (((float)(int)sVar8 + 0.5) / (float)_width) * -6.2831855 +
                                        3.1415927));
          fVar13 = cosf(__x);
          fVar14 = cosf((float)(1.5707963267948966 - elevation));
          fVar12 = acosf(fVar14 * fVar13 + fVar12 * fVar11 * fVar10);
          dVar18 = (double)fVar12;
          dVar15 = arhosek_tristim_skymodel_radiance(state,theta,dVar18,0);
          dVar16 = arhosek_tristim_skymodel_radiance(state_00,theta,dVar18,1);
          dVar18 = arhosek_tristim_skymodel_radiance(state_01,theta,dVar18,2);
          fVar11 = (float)dVar15 * 0.018398786;
          fVar13 = (float)dVar16 * 0.018398786;
          fVar10 = (float)dVar18 * 0.018398786;
          fVar12 = fVar13;
          if (fVar13 <= fVar19) {
            fVar12 = fVar19;
          }
          fVar19 = fVar12;
          lVar3 = lVar9 >> 0x1e;
          *(float *)((long)pfVar1 + lVar3) =
               fVar10 * -0.4985314 + fVar11 * 3.2404542 + fVar13 * -1.5371385;
          *(float *)((long)pfVar1 + lVar3 + 4) =
               fVar10 * 0.041556 + fVar11 * -0.969266 + fVar13 * 1.8760108;
          *(float *)((long)pfVar1 + lVar3 + 8) =
               fVar10 * 1.0572252 + fVar11 * 0.0556434 + fVar13 * -0.2040259;
          sVar8 = sVar8 + 1;
          lVar9 = lVar9 + 0x300000000;
        } while (_width != sVar8);
      }
      sVar2 = sVar2 + 1;
      lVar6 = lVar6 + _width * 0x300000000;
    } while (sVar2 != _height);
  }
  arhosekskymodelstate_free(state);
  arhosekskymodelstate_free(state_00);
  arhosekskymodelstate_free(state_01);
  if (_height != 0) {
    fVar19 = 1.0 / fVar19;
    iVar4 = 0;
    uVar5 = 0;
    do {
      sVar2 = _width;
      iVar7 = iVar4;
      if (_width != 0) {
        do {
          if (uVar5 < _height >> 1) {
            pfVar1[iVar7] = pfVar1[iVar7] * fVar19;
            pfVar1[(long)iVar7 + 1] = pfVar1[(long)iVar7 + 1] * fVar19;
            aVar17.z = pfVar1[(long)iVar7 + 2] * fVar19;
          }
          else {
            *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)(pfVar1 + iVar7) =
                 (_sky->groundAlbedo).field_0;
            *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)
             (pfVar1 + (long)iVar7 + 1) = (_sky->groundAlbedo).field_1;
            aVar17 = (_sky->groundAlbedo).field_2;
          }
          ((anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
          (pfVar1 + (long)iVar7 + 2))->z = (float)aVar17;
          iVar7 = iVar7 + 3;
          sVar2 = sVar2 - 1;
        } while (sVar2 != 0);
      }
      uVar5 = uVar5 + 1;
      iVar4 = iVar4 + (int)_width * 3;
    } while (uVar5 != _height);
  }
  return pfVar1;
}

Assistant:

float* skyEquirectangular(SkyData* _sky, size_t _width, size_t _height) {
    int nPixels = _width * _height * 3;
    float *data = new float[nPixels]; 

    // FILAMENT SKYGEN 
    // https://github.com/google/filament/blob/master/tools/skygen/src/main.cpp
    //
    float solarElevation = _sky->elevation;
    float sunTheta = float(HALF_PI - solarElevation);
    float sunPhi = 0.0f;
    bool normalize = true;

    ArHosekSkyModelState* skyState[9] = {
        arhosek_xyz_skymodelstate_alloc_init(_sky->turbidity, _sky->groundAlbedo.r, solarElevation),
        arhosek_xyz_skymodelstate_alloc_init(_sky->turbidity, _sky->groundAlbedo.g, solarElevation),
        arhosek_xyz_skymodelstate_alloc_init(_sky->turbidity, _sky->groundAlbedo.b, solarElevation)
    };

    glm::mat3 XYZ_sRGB = glm::mat3(
            3.2404542f, -0.9692660f,  0.0556434f,
            -1.5371385f,  1.8760108f, -0.2040259f,
            -0.4985314f,  0.0415560f,  1.0572252f
    );

    float maxSample = 0.00001f;
    for (int y = 0; y < _height; y++) {
        float v = (y + 0.5f) / _height;
        float theta = float(M_PI * v);

        if (theta > HALF_PI) 
            continue;
            
        for (int x = 0; x < _width; x++) {
            float u = (x + 0.5f) / _width;
            float phi = float(-2.0 * M_PI * u + M_PI + _sky->azimuth);
            float gamma = angleBetween(theta, phi, sunTheta, sunPhi);

            glm::vec3 sample = glm::vec3(
                arhosek_tristim_skymodel_radiance(skyState[0], theta, gamma, 0),
                arhosek_tristim_skymodel_radiance(skyState[1], theta, gamma, 1),
                arhosek_tristim_skymodel_radiance(skyState[2], theta, gamma, 2)
            );

            if (normalize)
                sample *= float(4.0 * M_PI / 683.0);

            maxSample = std::max(maxSample, sample.y);
            sample = XYZ_sRGB * sample;

            int index = (y * _width * 3) + x * 3;
            data[index] = sample.r;
            data[index + 1] = sample.g;
            data[index + 2] = sample.b;
        }
    }

    // cleanup sky data
    arhosekskymodelstate_free(skyState[0]);
    arhosekskymodelstate_free(skyState[1]);
    arhosekskymodelstate_free(skyState[2]);

    float hdrScale = 1.0f / (normalize ? maxSample : maxSample / 16.0f);

    for (int y = 0; y < _height; y++) {
        for (int x = 0; x < _width; x++) {
            int i = (y * _width) + x;
            i *= 3;

            if (y >= _height / 2) {
                data[i + 0] = _sky->groundAlbedo.r;
                data[i + 1] = _sky->groundAlbedo.g;
                data[i + 2] = _sky->groundAlbedo.b;
            }
            else {
                data[i + 0] *= hdrScale;
                data[i + 1] *= hdrScale;
                data[i + 2] *= hdrScale;
            }
        }
    }

    return data;
}